

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaFacetErr(xmlSchemaAbstractCtxtPtr actxt,xmlParserErrors error,xmlNodePtr node,
                      xmlChar *value,unsigned_long length,xmlSchemaTypePtr type,
                      xmlSchemaFacetPtr facet,char *message,xmlChar *str1,xmlChar *str2)

{
  xmlParserErrors error_00;
  xmlSchemaAbstractCtxtPtr actxt_00;
  int iVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  unsigned_long uVar4;
  xmlChar *str2_00;
  xmlChar local_98 [8];
  char actLen [25];
  char len [25];
  xmlSchemaTypeType local_4c;
  int nodeType;
  xmlSchemaTypeType facetType;
  xmlChar *msg;
  xmlChar *str;
  xmlSchemaTypePtr type_local;
  unsigned_long length_local;
  xmlChar *value_local;
  xmlNodePtr node_local;
  xmlSchemaAbstractCtxtPtr pxStack_10;
  xmlParserErrors error_local;
  xmlSchemaAbstractCtxtPtr actxt_local;
  
  msg = (xmlChar *)0x0;
  _nodeType = (xmlChar *)0x0;
  str = (xmlChar *)type;
  type_local = (xmlSchemaTypePtr)length;
  length_local = (unsigned_long)value;
  value_local = (xmlChar *)node;
  node_local._4_4_ = error;
  pxStack_10 = actxt;
  iVar1 = xmlSchemaEvalErrorNodeType(actxt,node);
  xmlSchemaFormatNodeForError((xmlChar **)&nodeType,pxStack_10,(xmlNodePtr)value_local);
  if (node_local._4_4_ == XML_SCHEMAV_CVC_ENUMERATION_VALID) {
    local_4c = XML_SCHEMA_FACET_ENUMERATION;
  }
  else {
    local_4c = facet->type;
  }
  _nodeType = xmlStrcat(_nodeType,"[");
  pxVar2 = xmlStrcat(_nodeType,(xmlChar *)"facet \'");
  _nodeType = pxVar2;
  pxVar3 = xmlSchemaFacetTypeToString(local_4c);
  _nodeType = xmlStrcat(pxVar2,pxVar3);
  _nodeType = xmlStrcat(_nodeType,(xmlChar *)"\'] ");
  if (message == (char *)0x0) {
    if (((local_4c == XML_SCHEMA_FACET_LENGTH) || (local_4c == XML_SCHEMA_FACET_MINLENGTH)) ||
       (local_4c == XML_SCHEMA_FACET_MAXLENGTH)) {
      if (iVar1 == 2) {
        _nodeType = xmlStrcat(_nodeType,(xmlChar *)"The value \'%s\' has a length of \'%s\'; ");
      }
      else {
        _nodeType = xmlStrcat(_nodeType,(xmlChar *)"The value has a length of \'%s\'; ");
      }
      uVar4 = xmlSchemaGetFacetValueAsULong(facet);
      snprintf(actLen + 0x18,0x18,"%lu",uVar4);
      snprintf((char *)local_98,0x18,"%lu",type_local);
      if (local_4c == XML_SCHEMA_FACET_LENGTH) {
        _nodeType = xmlStrcat(_nodeType,
                              (xmlChar *)"this differs from the allowed length of \'%s\'.\n");
      }
      else if (local_4c == XML_SCHEMA_FACET_MAXLENGTH) {
        _nodeType = xmlStrcat(_nodeType,
                              (xmlChar *)"this exceeds the allowed maximum length of \'%s\'.\n");
      }
      else if (local_4c == XML_SCHEMA_FACET_MINLENGTH) {
        _nodeType = xmlStrcat(_nodeType,
                              (xmlChar *)"this underruns the allowed minimum length of \'%s\'.\n");
      }
      if (iVar1 == 2) {
        xmlSchemaErr3(pxStack_10,node_local._4_4_,(xmlNodePtr)value_local,(char *)_nodeType,
                      (xmlChar *)length_local,local_98,(xmlChar *)(actLen + 0x18));
      }
      else {
        xmlSchemaErr(pxStack_10,node_local._4_4_,(xmlNodePtr)value_local,(char *)_nodeType,local_98,
                     (xmlChar *)(actLen + 0x18));
      }
    }
    else if (local_4c == XML_SCHEMA_FACET_ENUMERATION) {
      pxVar3 = xmlStrcat(_nodeType,
                         (xmlChar *)"The value \'%s\' is not an element of the set {%s}.\n");
      actxt_00 = pxStack_10;
      error_00 = node_local._4_4_;
      pxVar2 = value_local;
      uVar4 = length_local;
      _nodeType = pxVar3;
      str2_00 = xmlSchemaFormatFacetEnumSet(pxStack_10,&msg,(xmlSchemaTypePtr)str);
      xmlSchemaErr(actxt_00,error_00,(xmlNodePtr)pxVar2,(char *)pxVar3,(xmlChar *)uVar4,str2_00);
    }
    else if (local_4c == XML_SCHEMA_FACET_PATTERN) {
      _nodeType = xmlStrcat(_nodeType,
                            (xmlChar *)"The value \'%s\' is not accepted by the pattern \'%s\'.\n");
      xmlSchemaErr(pxStack_10,node_local._4_4_,(xmlNodePtr)value_local,(char *)_nodeType,
                   (xmlChar *)length_local,facet->value);
    }
    else if (local_4c == XML_SCHEMA_FACET_MININCLUSIVE) {
      _nodeType = xmlStrcat(_nodeType,
                            (xmlChar *)
                            "The value \'%s\' is less than the minimum value allowed (\'%s\').\n");
      xmlSchemaErr(pxStack_10,node_local._4_4_,(xmlNodePtr)value_local,(char *)_nodeType,
                   (xmlChar *)length_local,facet->value);
    }
    else if (local_4c == XML_SCHEMA_FACET_MAXINCLUSIVE) {
      _nodeType = xmlStrcat(_nodeType,
                            (xmlChar *)
                            "The value \'%s\' is greater than the maximum value allowed (\'%s\').\n"
                           );
      xmlSchemaErr(pxStack_10,node_local._4_4_,(xmlNodePtr)value_local,(char *)_nodeType,
                   (xmlChar *)length_local,facet->value);
    }
    else if (local_4c == XML_SCHEMA_FACET_MINEXCLUSIVE) {
      _nodeType = xmlStrcat(_nodeType,(xmlChar *)"The value \'%s\' must be greater than \'%s\'.\n");
      xmlSchemaErr(pxStack_10,node_local._4_4_,(xmlNodePtr)value_local,(char *)_nodeType,
                   (xmlChar *)length_local,facet->value);
    }
    else if (local_4c == XML_SCHEMA_FACET_MAXEXCLUSIVE) {
      _nodeType = xmlStrcat(_nodeType,(xmlChar *)"The value \'%s\' must be less than \'%s\'.\n");
      xmlSchemaErr(pxStack_10,node_local._4_4_,(xmlNodePtr)value_local,(char *)_nodeType,
                   (xmlChar *)length_local,facet->value);
    }
    else if (local_4c == XML_SCHEMA_FACET_TOTALDIGITS) {
      _nodeType = xmlStrcat(_nodeType,
                            (xmlChar *)
                            "The value \'%s\' has more digits than are allowed (\'%s\').\n");
      xmlSchemaErr(pxStack_10,node_local._4_4_,(xmlNodePtr)value_local,(char *)_nodeType,
                   (xmlChar *)length_local,facet->value);
    }
    else if (local_4c == XML_SCHEMA_FACET_FRACTIONDIGITS) {
      _nodeType = xmlStrcat(_nodeType,
                            (xmlChar *)
                            "The value \'%s\' has more fractional digits than are allowed (\'%s\').\n"
                           );
      xmlSchemaErr(pxStack_10,node_local._4_4_,(xmlNodePtr)value_local,(char *)_nodeType,
                   (xmlChar *)length_local,facet->value);
    }
    else if (iVar1 == 2) {
      _nodeType = xmlStrcat(_nodeType,(xmlChar *)"The value \'%s\' is not facet-valid.\n");
      xmlSchemaErr(pxStack_10,node_local._4_4_,(xmlNodePtr)value_local,(char *)_nodeType,
                   (xmlChar *)length_local,(xmlChar *)0x0);
    }
    else {
      _nodeType = xmlStrcat(_nodeType,(xmlChar *)"The value is not facet-valid.\n");
      xmlSchemaErr(pxStack_10,node_local._4_4_,(xmlNodePtr)value_local,(char *)_nodeType,
                   (xmlChar *)0x0,(xmlChar *)0x0);
    }
  }
  else {
    _nodeType = xmlStrcat(_nodeType,(xmlChar *)message);
    _nodeType = xmlStrcat(_nodeType,".\n");
    xmlSchemaErr(pxStack_10,node_local._4_4_,(xmlNodePtr)value_local,(char *)_nodeType,str1,str2);
  }
  if (msg != (xmlChar *)0x0) {
    (*xmlFree)(msg);
    msg = (xmlChar *)0x0;
  }
  (*xmlFree)(_nodeType);
  return;
}

Assistant:

static void LIBXML_ATTR_FORMAT(8,0)
xmlSchemaFacetErr(xmlSchemaAbstractCtxtPtr actxt,
		  xmlParserErrors error,
		  xmlNodePtr node,
		  const xmlChar *value,
		  unsigned long length,
		  xmlSchemaTypePtr type,
		  xmlSchemaFacetPtr facet,
		  const char *message,
		  const xmlChar *str1,
		  const xmlChar *str2)
{
    xmlChar *str = NULL, *msg = NULL;
    xmlSchemaTypeType facetType;
    int nodeType = xmlSchemaEvalErrorNodeType(actxt, node);

    xmlSchemaFormatNodeForError(&msg, actxt, node);
    if (error == XML_SCHEMAV_CVC_ENUMERATION_VALID) {
	facetType = XML_SCHEMA_FACET_ENUMERATION;
	/*
	* If enumerations are validated, one must not expect the
	* facet to be given.
	*/
    }